

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_quote(Curl_easy *data,_Bool init,ftpstate instate)

{
  anon_union_248_5_a113b5f6_for_proto *pp;
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  CURLcode CVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  connectdata *conn;
  bool bVar9;
  
  lVar4 = 0x4f0;
  if (instate - FTP_RETR_PREQUOTE < 3) {
    lVar4 = *(long *)(&DAT_005c4888 + (ulong)(instate - FTP_RETR_PREQUOTE) * 8);
  }
  pcVar1 = data->conn;
  puVar5 = *(undefined8 **)((long)&data->magic + lVar4);
  iVar6 = 0;
  if (!init) {
    iVar6 = (pcVar1->proto).ftpc.count1 + 1;
  }
  pFVar2 = (data->req).p.file;
  pp = &pcVar1->proto;
  (pcVar1->proto).ftpc.count1 = iVar6;
  if (puVar5 != (undefined8 *)0x0) {
    iVar8 = 0;
    for (; (iVar8 < iVar6 && (puVar5 != (undefined8 *)0x0)); puVar5 = (undefined8 *)puVar5[1]) {
      iVar8 = iVar8 + 1;
    }
    if (puVar5 != (undefined8 *)0x0) {
      pcVar7 = (char *)*puVar5;
      bVar9 = *pcVar7 == '*';
      *(uint *)((long)&pcVar1->proto + 200) = (uint)bVar9;
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s",pcVar7 + bVar9);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      (data->conn->proto).ftpc.state = instate;
      return CURLE_OK;
    }
  }
  if (instate == FTP_RETR_PREQUOTE) {
    if (pFVar2->fd == 0) {
      lVar4 = (pcVar1->proto).ftpc.known_filesize;
      if (lVar4 != -1) {
        Curl_pgrsSetDownloadSize(data,lVar4);
        CVar3 = ftp_state_retr(data,(pcVar1->proto).ftpc.known_filesize);
        return CVar3;
      }
      if ((((data->set).field_0x8e6 & 2) == 0) && (((data->state).field_0x6d1 & 0x80) == 0)) {
        CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"SIZE %s",(pcVar1->proto).ftpc.file);
        if (CVar3 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_RETR_SIZE;
          CVar3 = CURLE_OK;
        }
      }
      else {
        CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(pcVar1->proto).ftpc.file);
        if (CVar3 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_RETR;
          CVar3 = CURLE_OK;
        }
      }
    }
    else {
      (pcVar1->proto).ftpc.state = FTP_STOP;
      CVar3 = CURLE_OK;
    }
  }
  else {
    if (instate == FTP_STOR_PREQUOTE) {
      CVar3 = ftp_state_ul_setup(data,false);
      return CVar3;
    }
    CVar3 = CURLE_OK;
    if (instate != FTP_POSTQUOTE) {
      if ((pcVar1->proto).ftpc.cwddone == true) {
LAB_0042f593:
        CVar3 = ftp_state_mdtm(data);
        return CVar3;
      }
      (pcVar1->proto).ftpc.count2 = 0;
      if (((((pcVar1->bits).field_0x4 & 0x80) == 0) ||
          (pcVar7 = (pcVar1->proto).ftpc.entrypath, pcVar7 == (char *)0x0)) ||
         (((pcVar1->proto).ftpc.dirdepth != 0 && (**(pcVar1->proto).ftpc.dirs == '/')))) {
        if ((pcVar1->proto).ftpc.dirdepth == 0) goto LAB_0042f593;
        (pcVar1->proto).ftpc.cwdcount = 1;
        pcVar7 = *(pcVar1->proto).ftpc.dirs;
      }
      else {
        (pcVar1->proto).ftpc.cwdcount = 0;
      }
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"CWD %s",pcVar7);
      if (CVar3 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_CWD;
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_quote(struct Curl_easy *data,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s", cmd);
      if(result)
        return result;
      state(data, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(data, conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != PPTRANSFER_BODY)
        state(data, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(data, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl || data->state.prefer_ascii) {
            /* 'ignorecl' is used to support download of growing files.  It
               prevents the state machine from requesting the file size from
               the server.  With an unknown file size the download continues
               until the server terminates it, otherwise the client stops if
               the received byte count exceeds the reported file size.  Set
               option CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this
               behavior.

               In addition: asking for the size for 'TYPE A' transfers is not
               constructive since servers don't report the converted size. So
               skip it.
            */
            result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
            if(!result)
              state(data, FTP_RETR);
          }
          else {
            result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
            if(!result)
              state(data, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(data, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}